

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void Scale2Ratio(AOM_SCALING_MODE mode,int *hr,int *hs)

{
  int *hs_local;
  int *hr_local;
  AOM_SCALING_MODE mode_local;
  
  switch(mode) {
  case AOME_NORMAL:
    *hr = 1;
    *hs = 1;
    break;
  case AOME_FOURFIVE:
    *hr = 4;
    *hs = 5;
    break;
  case AOME_THREEFIVE:
    *hr = 3;
    *hs = 5;
    break;
  case AOME_THREEFOUR:
    *hr = 3;
    *hs = 4;
    break;
  case AOME_ONEFOUR:
    *hr = 1;
    *hs = 4;
    break;
  case AOME_ONEEIGHT:
    *hr = 1;
    *hs = 8;
    break;
  case AOME_ONETWO:
    *hr = 1;
    *hs = 2;
    break;
  case AOME_TWOTHREE:
    *hr = 2;
    *hs = 3;
    break;
  case AOME_ONETHREE:
    *hr = 1;
    *hs = 3;
    break;
  default:
    *hr = 1;
    *hs = 1;
  }
  return;
}

Assistant:

static inline void Scale2Ratio(AOM_SCALING_MODE mode, int *hr, int *hs) {
  switch (mode) {
    case AOME_NORMAL:
      *hr = 1;
      *hs = 1;
      break;
    case AOME_FOURFIVE:
      *hr = 4;
      *hs = 5;
      break;
    case AOME_THREEFIVE:
      *hr = 3;
      *hs = 5;
      break;
    case AOME_THREEFOUR:
      *hr = 3;
      *hs = 4;
      break;
    case AOME_ONEFOUR:
      *hr = 1;
      *hs = 4;
      break;
    case AOME_ONEEIGHT:
      *hr = 1;
      *hs = 8;
      break;
    case AOME_ONETWO:
      *hr = 1;
      *hs = 2;
      break;
    case AOME_TWOTHREE:
      *hr = 2;
      *hs = 3;
      break;
    case AOME_ONETHREE:
      *hr = 1;
      *hs = 3;
      break;
    default:
      *hr = 1;
      *hs = 1;
      assert(0);
      break;
  }
}